

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O1

void __thiscall
ClipperLib::PolyOffsetBuilder::PolyOffsetBuilder
          (PolyOffsetBuilder *this,Polygons *in_polys,Polygons *out_polys,double delta,
          JoinType jointype,double MiterLimit)

{
  pointer pvVar1;
  long *plVar2;
  pointer pDVar3;
  IntPoint *pt2;
  long lVar4;
  size_t sVar5;
  iterator __position;
  double dVar6;
  double dVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  bool bVar10;
  ulong uVar11;
  pointer pIVar12;
  undefined1 *puVar13;
  ulong uVar14;
  undefined1 *puVar15;
  undefined1 *puVar16;
  ulong __new_size;
  undefined4 uVar17;
  undefined4 uVar18;
  undefined4 in_XMM0_Dc;
  undefined4 in_XMM0_Dd;
  DoublePoint DVar19;
  IntRect r;
  Polygon outer;
  Clipper clpr;
  IntRect local_158;
  vector<ClipperLib::DoublePoint,_std::allocator<ClipperLib::DoublePoint>_> *local_138;
  Polygons *local_130;
  undefined1 local_128 [16];
  Polygon local_118;
  undefined1 local_f8 [136];
  ClipperBase local_70;
  
  (this->m_p).
  super__Vector_base<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_p).
  super__Vector_base<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_p).
  super__Vector_base<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_138 = &this->normals;
  (this->normals).
  super__Vector_base<ClipperLib::DoublePoint,_std::allocator<ClipperLib::DoublePoint>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->normals).
  super__Vector_base<ClipperLib::DoublePoint,_std::allocator<ClipperLib::DoublePoint>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->normals).
  super__Vector_base<ClipperLib::DoublePoint,_std::allocator<ClipperLib::DoublePoint>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (1e-20 <= ABS(delta)) {
    std::
    vector<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
    ::operator=(&this->m_p,in_polys);
    this->m_delta = delta;
    this->m_jointype = jointype;
    dVar7 = 1.0;
    if (1.0 <= MiterLimit) {
      dVar7 = MiterLimit;
    }
    this->m_RMin = 2.0 / (dVar7 * dVar7);
    std::
    vector<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
    ::_M_erase_at_end(out_polys,
                      (out_polys->
                      super__Vector_base<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_start);
    std::
    vector<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
    ::resize(out_polys,
             ((long)(in_polys->
                    super__Vector_base<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish -
              (long)(in_polys->
                    super__Vector_base<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555);
    this->m_i = 0;
    if ((in_polys->
        super__Vector_base<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
        )._M_impl.super__Vector_impl_data._M_finish !=
        (in_polys->
        super__Vector_base<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
        )._M_impl.super__Vector_impl_data._M_start) {
      local_128._8_4_ = in_XMM0_Dc;
      local_128._0_8_ = delta * delta * 3.141592653589793;
      local_128._12_4_ = in_XMM0_Dd;
      uVar14 = 0;
      local_130 = out_polys;
      do {
        this->m_curr_poly =
             (out_polys->
             super__Vector_base<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start + uVar14;
        pvVar1 = (in_polys->
                 super__Vector_base<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        __new_size = (long)*(pointer *)
                            ((long)&pvVar1[uVar14].
                                    super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>
                                    ._M_impl.super__Vector_impl_data + 8) -
                     *(long *)&pvVar1[uVar14].
                               super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>
                               ._M_impl.super__Vector_impl_data >> 4;
        if (1 < __new_size) {
          plVar2 = *(long **)&(this->m_p).
                              super__Vector_base<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[uVar14].
                              super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>
                              ._M_impl;
          uVar11 = __new_size - 1;
          if ((*plVar2 == plVar2[uVar11 * 2]) && (plVar2[1] == plVar2[uVar11 * 2 + 1])) {
            __new_size = uVar11;
          }
        }
        dVar6 = Area(pvVar1 + uVar14);
        if (0.0 <= delta) {
          bVar10 = -dVar6 < (double)local_128._0_8_ && dVar6 < 0.0;
        }
        else {
          bVar10 = dVar6 < (double)local_128._0_8_ && 0.0 < dVar6;
        }
        if (bVar10) {
          __new_size = 0;
        }
        if ((__new_size != 0) && (0.0 < delta || 2 < __new_size)) {
          if (__new_size == 1) {
            local_f8._0_8_ = (pointer)0x0;
            local_f8._8_8_ = (pointer)0x0;
            local_f8._16_8_ = (pointer)0x0;
            BuildArc((Polygon *)&local_158,
                     (in_polys->
                     super__Vector_base<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start[this->m_i].
                     super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>
                     ._M_impl.super__Vector_impl_data._M_start,0.0,6.283185307179586,delta);
            uVar9 = local_f8._16_8_;
            uVar8 = local_f8._0_8_;
            local_f8._0_8_ = local_158.left;
            local_f8._8_8_ = local_158.top;
            local_f8._16_8_ = local_158.right;
            local_158.left = 0;
            local_158.top = 0;
            local_158.right = 0;
            if ((pointer)uVar8 != (pointer)0x0) {
              operator_delete((void *)uVar8,uVar9 - uVar8);
            }
            if ((pointer)local_158.left != (pointer)0x0) {
              operator_delete((void *)local_158.left,local_158.right - local_158.left);
            }
            std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>::operator=
                      ((out_polys->
                       super__Vector_base<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_start + this->m_i,
                       (vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_> *)
                       local_f8);
            if ((pointer)local_f8._0_8_ != (pointer)0x0) {
              operator_delete((void *)local_f8._0_8_,local_f8._16_8_ - local_f8._0_8_);
            }
          }
          else {
            pDVar3 = (this->normals).
                     super__Vector_base<ClipperLib::DoublePoint,_std::allocator<ClipperLib::DoublePoint>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            if ((this->normals).
                super__Vector_base<ClipperLib::DoublePoint,_std::allocator<ClipperLib::DoublePoint>_>
                ._M_impl.super__Vector_impl_data._M_finish != pDVar3) {
              (this->normals).
              super__Vector_base<ClipperLib::DoublePoint,_std::allocator<ClipperLib::DoublePoint>_>.
              _M_impl.super__Vector_impl_data._M_finish = pDVar3;
            }
            std::vector<ClipperLib::DoublePoint,_std::allocator<ClipperLib::DoublePoint>_>::resize
                      (local_138,__new_size);
            uVar14 = __new_size - 1;
            pt2 = (in_polys->
                  super__Vector_base<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start[this->m_i].
                  super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>.
                  _M_impl.super__Vector_impl_data._M_start;
            DVar19 = GetUnitNormal(pt2 + uVar14,pt2);
            pDVar3 = (this->normals).
                     super__Vector_base<ClipperLib::DoublePoint,_std::allocator<ClipperLib::DoublePoint>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            pDVar3[uVar14].X = DVar19.X;
            pDVar3[uVar14].Y = DVar19.Y;
            this->m_j = 0;
            if (uVar14 != 0) {
              uVar11 = 0;
              do {
                lVar4 = *(long *)&(in_polys->
                                  super__Vector_base<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
                                  )._M_impl.super__Vector_impl_data._M_start[this->m_i].
                                  super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>
                                  ._M_impl.super__Vector_impl_data;
                DVar19 = GetUnitNormal((IntPoint *)(lVar4 + uVar11 * 0x10),
                                       (IntPoint *)(lVar4 + uVar11 * 0x10 + 0x10));
                pDVar3 = (this->normals).
                         super__Vector_base<ClipperLib::DoublePoint,_std::allocator<ClipperLib::DoublePoint>_>
                         ._M_impl.super__Vector_impl_data._M_start;
                sVar5 = this->m_j;
                pDVar3[sVar5].X = DVar19.X;
                pDVar3[sVar5].Y = DVar19.Y;
                uVar11 = this->m_j + 1;
                this->m_j = uVar11;
              } while (uVar11 < uVar14);
            }
            out_polys = local_130;
            this->m_k = uVar14;
            this->m_j = 0;
            uVar14 = 0;
            do {
              uVar17 = 0;
              uVar18 = 0x3ff00000;
              if (jointype == jtSquare) {
LAB_006888da:
                DoSquare(this,(double)CONCAT44(uVar18,uVar17));
              }
              else if (jointype == jtRound) {
                DoRound(this);
              }
              else if (jointype == jtMiter) {
                pDVar3 = (this->normals).
                         super__Vector_base<ClipperLib::DoublePoint,_std::allocator<ClipperLib::DoublePoint>_>
                         ._M_impl.super__Vector_impl_data._M_start;
                dVar6 = pDVar3[uVar14].X * pDVar3[this->m_k].X +
                        pDVar3[uVar14].Y * pDVar3[this->m_k].Y + 1.0;
                this->m_R = dVar6;
                uVar17 = SUB84(dVar7,0);
                uVar18 = (undefined4)((ulong)dVar7 >> 0x20);
                if (dVar6 < this->m_RMin) goto LAB_006888da;
                DoMiter(this);
              }
              this->m_k = this->m_j;
              uVar14 = this->m_j + 1;
              this->m_j = uVar14;
            } while (uVar14 < __new_size);
          }
        }
        uVar14 = this->m_i + 1;
        this->m_i = uVar14;
      } while (uVar14 < (ulong)(((long)(in_polys->
                                       super__Vector_base<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
                                       )._M_impl.super__Vector_impl_data._M_finish -
                                 (long)(in_polys->
                                       super__Vector_base<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
                                       )._M_impl.super__Vector_impl_data._M_start >> 3) *
                               -0x5555555555555555));
    }
    local_70.m_edges.super__Vector_base<ClipperLib::TEdge_*,_std::allocator<ClipperLib::TEdge_*>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_70.m_edges.super__Vector_base<ClipperLib::TEdge_*,_std::allocator<ClipperLib::TEdge_*>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_70.m_edges.super__Vector_base<ClipperLib::TEdge_*,_std::allocator<ClipperLib::TEdge_*>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_70.m_CurrentLM = (LocalMinima *)0x0;
    local_70.m_MinimaList = (LocalMinima *)0x0;
    local_f8._0_8_ = &PTR__Clipper_008fef88;
    local_70._vptr_ClipperBase = (_func_int **)&PTR__Clipper_008fefd8;
    local_70.m_UseFullRange = false;
    local_f8[0x84] = false;
    local_f8._8_8_ = (pointer)0x0;
    local_f8._16_8_ = (pointer)0x0;
    local_f8._24_8_ = (pointer)0x0;
    local_f8._32_8_ = (pointer)0x0;
    local_f8._40_8_ = (pointer)0x0;
    local_f8._48_8_ = (pointer)0x0;
    local_f8._56_8_ = (pointer)0x0;
    local_f8._64_8_ = (pointer)0x0;
    local_f8._72_8_ = (pointer)0x0;
    local_f8._88_8_ = (Scanbeam *)0x0;
    local_f8._96_8_ = (TEdge *)0x0;
    local_f8._104_8_ = (TEdge *)0x0;
    local_f8._112_8_ = (IntersectNode *)0x0;
    local_f8[0x78] = false;
    ClipperBase::AddPolygons(&local_70,out_polys,ptSubject);
    if (delta <= 0.0) {
      ClipperBase::GetBounds
                (&local_158,(ClipperBase *)(local_f8 + ((pointer)(local_f8._0_8_ + -0x20))->Y));
      local_118.super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_118.super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_118.super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      pIVar12 = (pointer)operator_new(0x40);
      local_118.super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>.
      _M_impl.super__Vector_impl_data._M_finish = pIVar12 + 4;
      pIVar12[3].X = 0;
      pIVar12[3].Y = 0;
      pIVar12[2].X = 0;
      pIVar12[2].Y = 0;
      pIVar12[1].X = 0;
      pIVar12[1].Y = 0;
      pIVar12->X = 0;
      pIVar12->Y = 0;
      puVar13 = (undefined1 *)((long)&((pointer)(local_158.left + -0x10))->X + 6);
      pIVar12->X = (long64)puVar13;
      pIVar12->Y = local_158.bottom + 10;
      puVar16 = (undefined1 *)((long)(local_158.right + 8) + 2);
      pIVar12[1].X = (long64)puVar16;
      pIVar12[1].Y = local_158.bottom + 10;
      puVar15 = (undefined1 *)((long)&((pointer)(local_158.top + -0x10))->X + 6);
      pIVar12[2].X = (long64)puVar16;
      pIVar12[2].Y = (long64)puVar15;
      pIVar12[3].X = (long64)puVar13;
      pIVar12[3].Y = (long64)puVar15;
      local_118.super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>.
      _M_impl.super__Vector_impl_data._M_start = pIVar12;
      local_118.super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage =
           local_118.super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      ClipperBase::AddPolygon
                ((ClipperBase *)(local_f8 + ((pointer)(local_f8._0_8_ + -0x20))->Y),&local_118,
                 ptSubject);
      bVar10 = Clipper::Execute((Clipper *)local_f8,ctUnion,out_polys,pftNegative,pftNegative);
      __position._M_current =
           (out_polys->
           super__Vector_base<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
      if (bVar10) {
        std::
        vector<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
        ::_M_erase(out_polys,__position);
        ReversePolygons(out_polys);
      }
      else {
        std::
        vector<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
        ::_M_erase_at_end(out_polys,__position._M_current);
      }
      operator_delete(pIVar12,0x40);
    }
    else {
      bVar10 = Clipper::Execute((Clipper *)local_f8,ctUnion,out_polys,pftPositive,pftPositive);
      if (!bVar10) {
        std::
        vector<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
        ::_M_erase_at_end(out_polys,
                          (out_polys->
                          super__Vector_base<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_start);
      }
    }
    Clipper::~Clipper((Clipper *)local_f8,&Clipper::VTT);
    ClipperBase::~ClipperBase(&local_70);
  }
  else {
    std::
    vector<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
    ::operator=(out_polys,in_polys);
  }
  return;
}

Assistant:

PolyOffsetBuilder(const Polygons& in_polys, Polygons& out_polys,
  double delta, JoinType jointype, double MiterLimit)
{
    //nb precondition - out_polys != ptsin_polys
    if (NEAR_ZERO(delta))
    {
        out_polys = in_polys;
        return;
    }

    this->m_p = in_polys;
    this->m_delta = delta;
    this->m_jointype = jointype;
    if (MiterLimit <= 1) MiterLimit = 1;
    m_RMin = 2/(MiterLimit*MiterLimit);
 
    double deltaSq = delta*delta;
    out_polys.clear();
    out_polys.resize(in_polys.size());
    for (m_i = 0; m_i < in_polys.size(); m_i++)
    {
        m_curr_poly = &out_polys[m_i];
        size_t len = in_polys[m_i].size();
        if (len > 1 && m_p[m_i][0].X == m_p[m_i][len - 1].X &&
            m_p[m_i][0].Y == m_p[m_i][len-1].Y) len--;

        //when 'shrinking' polygons - to minimize artefacts
        //strip those polygons that have an area < pi * delta^2 ...
        double a1 = Area(in_polys[m_i]);
        if (delta < 0) { if (a1 > 0 && a1 < deltaSq *pi) len = 0; }
        else if (a1 < 0 && -a1 < deltaSq *pi) len = 0; //holes have neg. area

        if (len == 0 || (len < 3 && delta <= 0))
          continue;
        else if (len == 1)
        {
            Polygon arc;
            arc = BuildArc(in_polys[m_i][len-1], 0, 2 * pi, delta);
            out_polys[m_i] = arc;
            continue;
        }

        //build normals ...
        normals.clear();
        normals.resize(len);
        normals[len-1] = GetUnitNormal(in_polys[m_i][len-1], in_polys[m_i][0]);
        for (m_j = 0; m_j < len -1; ++m_j)
            normals[m_j] = GetUnitNormal(in_polys[m_i][m_j], in_polys[m_i][m_j+1]);
        
        m_k = len -1;
        for (m_j = 0; m_j < len; ++m_j)
        {
          switch (jointype)
          {
            case jtMiter:
            {
              m_R = 1 + (normals[m_j].X*normals[m_k].X + 
                normals[m_j].Y*normals[m_k].Y);
              if (m_R >= m_RMin) DoMiter(); else DoSquare(MiterLimit);
              break;
            }
            case jtSquare: DoSquare(); break;
            case jtRound: DoRound(); break;
          }
        m_k = m_j;
        }
    }

    //finally, clean up untidy corners using Clipper ...
    Clipper clpr;
    clpr.AddPolygons(out_polys, ptSubject);
    if (delta > 0)
    {
        if (!clpr.Execute(ctUnion, out_polys, pftPositive, pftPositive))
            out_polys.clear();
    }
    else
    {
        IntRect r = clpr.GetBounds();
        Polygon outer(4);
        outer[0] = IntPoint(r.left - 10, r.bottom + 10);
        outer[1] = IntPoint(r.right + 10, r.bottom + 10);
        outer[2] = IntPoint(r.right + 10, r.top - 10);
        outer[3] = IntPoint(r.left - 10, r.top - 10);

        clpr.AddPolygon(outer, ptSubject);
        if (clpr.Execute(ctUnion, out_polys, pftNegative, pftNegative))
        {
            out_polys.erase(out_polys.begin());
            ReversePolygons(out_polys);

        } else
            out_polys.clear();
    }
}